

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O3

void __thiscall Assimp::BVHLoader::ReadNodeOffset(BVHLoader *this,aiNode *pNode)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = GetNextTokenAsFloat(this);
  fVar2 = GetNextTokenAsFloat(this);
  fVar3 = GetNextTokenAsFloat(this);
  (pNode->mTransformation).a1 = 1.0;
  (pNode->mTransformation).a2 = 0.0;
  (pNode->mTransformation).a3 = 0.0;
  (pNode->mTransformation).a4 = fVar1;
  (pNode->mTransformation).b1 = 0.0;
  (pNode->mTransformation).b2 = 1.0;
  (pNode->mTransformation).b3 = 0.0;
  (pNode->mTransformation).b4 = fVar2;
  (pNode->mTransformation).c1 = 0.0;
  (pNode->mTransformation).c2 = 0.0;
  (pNode->mTransformation).c3 = 1.0;
  (pNode->mTransformation).c4 = fVar3;
  (pNode->mTransformation).d1 = 0.0;
  (pNode->mTransformation).d2 = 0.0;
  (pNode->mTransformation).d3 = 0.0;
  (pNode->mTransformation).d4 = 1.0;
  return;
}

Assistant:

void BVHLoader::ReadNodeOffset( aiNode* pNode)
{
    // Offset consists of three floats to read
    aiVector3D offset;
    offset.x = GetNextTokenAsFloat();
    offset.y = GetNextTokenAsFloat();
    offset.z = GetNextTokenAsFloat();

    // build a transformation matrix from it
    pNode->mTransformation = aiMatrix4x4( 1.0f, 0.0f, 0.0f, offset.x,
                                          0.0f, 1.0f, 0.0f, offset.y,
                                          0.0f, 0.0f, 1.0f, offset.z,
                                          0.0f, 0.0f, 0.0f, 1.0f);
}